

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_count_edges.h
# Opt level: O2

int s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(S2ShapeIndex *index,int max_edges)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar5;
  S2ShapeIndex *__range2;
  ShapeIterator it;
  ShapeIterator local_38;
  long *plVar4;
  
  local_38.shape_id_ = 0;
  local_38.index_ = index;
  iVar2 = (*index->_vptr_S2ShapeIndex[2])();
  iVar5 = 0;
  do {
    it.shape_id_ = iVar2;
    it.index_ = index;
    it._12_4_ = 0;
    bVar1 = S2ShapeIndex::ShapeIterator::operator!=(&local_38,it);
    if (!bVar1) {
      return iVar5;
    }
    iVar3 = (*(local_38.index_)->_vptr_S2ShapeIndex[3])
                      (local_38.index_,(ulong)(uint)local_38.shape_id_);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar4 != (long *)0x0) {
      iVar3 = (**(code **)(*plVar4 + 0x10))(plVar4);
      iVar5 = iVar5 + iVar3;
      if (max_edges <= iVar5) {
        return iVar5;
      }
    }
    local_38.shape_id_ = local_38.shape_id_ + 1;
  } while( true );
}

Assistant:

int CountEdgesUpTo(const S2ShapeIndexType& index, int max_edges) {
  int num_edges = 0;
  for (S2Shape* shape : index) {
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= max_edges) break;
  }
  return num_edges;
}